

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_time.cc
# Opt level: O0

ASN1_TIME * ASN1_TIME_adj(ASN1_TIME *s,time_t t,int offset_day,long offset_sec)

{
  int iVar1;
  undefined1 local_68 [8];
  tm tm;
  long offset_sec_local;
  int offset_day_local;
  int64_t posix_time_local;
  ASN1_TIME *s_local;
  
  tm.tm_zone = (char *)offset_sec;
  iVar1 = OPENSSL_posix_to_tm(t,(tm *)local_68);
  if (iVar1 == 0) {
    ERR_put_error(0xc,0,0x71,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_time.cc"
                  ,0x35);
    s_local = (ASN1_TIME *)0x0;
  }
  else if (((offset_day == 0) && (tm.tm_zone == (char *)0x0)) ||
          (iVar1 = OPENSSL_gmtime_adj((tm *)local_68,offset_day,(int64_t)tm.tm_zone), iVar1 != 0)) {
    iVar1 = fits_in_utc_time((tm *)local_68);
    if (iVar1 == 0) {
      s_local = (ASN1_TIME *)ASN1_GENERALIZEDTIME_adj(s,t,offset_day,(long)tm.tm_zone);
    }
    else {
      s_local = (ASN1_TIME *)ASN1_UTCTIME_adj(s,t,offset_day,(long)tm.tm_zone);
    }
  }
  else {
    s_local = (ASN1_TIME *)0x0;
  }
  return (ASN1_TIME *)s_local;
}

Assistant:

ASN1_TIME *ASN1_TIME_adj(ASN1_TIME *s, int64_t posix_time, int offset_day,
                         long offset_sec) {
  struct tm tm;

  if (!OPENSSL_posix_to_tm(posix_time, &tm)) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ERROR_GETTING_TIME);
    return NULL;
  }
  if (offset_day || offset_sec) {
    if (!OPENSSL_gmtime_adj(&tm, offset_day, offset_sec)) {
      return NULL;
    }
  }
  if (fits_in_utc_time(&tm)) {
    return ASN1_UTCTIME_adj(s, posix_time, offset_day, offset_sec);
  }
  return ASN1_GENERALIZEDTIME_adj(s, posix_time, offset_day, offset_sec);
}